

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionPrivate::startHostInfoLookup(QHttpNetworkConnectionPrivate *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  bool bVar5;
  Capabilities CVar6;
  NetworkLayerProtocol NVar7;
  QNetworkProxy *this_00;
  long in_FS_OFFSET;
  bool immediateResultValid;
  int hostLookupId;
  QHostAddress temp;
  QHostInfo hostInfo;
  char local_65 [5];
  QHostAddress local_60;
  QString local_58;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->networkLayerState = HostLookupPending;
  local_58.d.d = (this->hostName).d.d;
  local_58.d.ptr = (this->hostName).d.ptr;
  local_58.d.size = (this->hostName).d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = &this->networkProxy;
  CVar6 = QNetworkProxy::capabilities(this_00);
  if (((uint)CVar6.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
             super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x10) == 0) {
    CVar6 = QNetworkProxy::capabilities(&this->channels->proxy);
    if (((uint)CVar6.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
               super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x10) != 0) {
      this_00 = &this->channels->proxy;
      goto LAB_00200b32;
    }
  }
  else {
LAB_00200b32:
    QNetworkProxy::hostName(&local_38,this_00);
    qVar4 = local_38.d.size;
    pDVar3 = local_38.d.d;
    pcVar2 = local_58.d.ptr;
    pDVar1 = local_58.d.d;
    local_38.d.d = local_58.d.d;
    local_58.d.d = pDVar3;
    local_58.d.ptr = local_38.d.ptr;
    local_38.d.ptr = pcVar2;
    local_38.d.size = local_58.d.size;
    local_58.d.size = qVar4;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
  }
  local_60.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_60);
  bVar5 = QHostAddress::setAddress(&local_60,&local_58);
  if (bVar5) {
    NVar7 = QHostAddress::protocol(&local_60);
    if (NVar7 == IPv6Protocol) {
      this->networkLayerState = IPv6;
    }
    else {
      if (NVar7 != IPv4Protocol) goto LAB_00200c65;
      this->networkLayerState = IPv4;
    }
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char16_t *)0x0;
    local_38.d.size = 0;
    QMetaObject::invokeMethodImpl
              (*(QObject **)&this->field_0x8,"_q_startNextRequest",QueuedConnection,1,
               (void **)&local_38,(char **)&local_38.d.ptr,(QMetaTypeInterface **)&local_38.d.size);
  }
  else {
    local_65[1] = -0x56;
    local_65[2] = -0x56;
    local_65[3] = -0x56;
    local_65[4] = -0x56;
    local_65[0] = '\0';
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    qt_qhostinfo_lookup(&local_38,(QObject *)&local_58,*(char **)&this->field_0x8,
                        (bool *)"1_q_hostLookupFinished(QHostInfo)",(int *)local_65);
    if (local_65[0] == '\x01') {
      _q_hostLookupFinished(this,(QHostInfo *)&local_38);
    }
    QHostInfo::~QHostInfo((QHostInfo *)&local_38);
  }
LAB_00200c65:
  QHostAddress::~QHostAddress(&local_60);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::startHostInfoLookup()
{
    networkLayerState = HostLookupPending;

    // check if we already now can decide if this is IPv4 or IPv6
    QString lookupHost = hostName;
#ifndef QT_NO_NETWORKPROXY
    if (networkProxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = networkProxy.hostName();
    } else if (channels[0].proxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = channels[0].proxy.hostName();
    }
#endif
    QHostAddress temp;
    if (temp.setAddress(lookupHost)) {
        const QAbstractSocket::NetworkLayerProtocol protocol = temp.protocol();
        if (protocol == QAbstractSocket::IPv4Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        } else if (protocol == QAbstractSocket::IPv6Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
    } else {
        int hostLookupId;
        bool immediateResultValid = false;
        QHostInfo hostInfo = qt_qhostinfo_lookup(lookupHost,
                                                 this->q_func(),
                                                 SLOT(_q_hostLookupFinished(QHostInfo)),
                                                 &immediateResultValid,
                                                 &hostLookupId);
        if (immediateResultValid) {
            _q_hostLookupFinished(hostInfo);
        }
    }
}